

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QPermission *permission)

{
  char *pcVar1;
  int iVar2;
  QMetaType QVar3;
  storage_type *in_RCX;
  undefined1 *puVar4;
  int *in_RDX;
  char *pcVar5;
  QString *this;
  QTextStream *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebug local_58;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(*(long *)permission + 0x34);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)permission);
  local_60.stream = *(Stream **)permission;
  (local_60.stream)->space = false;
  (local_60.stream)->verbosity = 0;
  if (iVar2 < 2) goto LAB_004b6e33;
  QVar3 = QVariant::metaType((QVariant *)(in_RDX + 2));
  if (QVar3.d_ptr == (QMetaTypeInterface *)0x0) {
    pQVar6 = *(QTextStream **)permission;
LAB_004b6d7e:
    pcVar5 = (char *)0x0;
    this = (QString *)0x0;
  }
  else {
    pcVar5 = (QVar3.d_ptr)->name;
    pQVar6 = *(QTextStream **)permission;
    if (pcVar5 == (char *)0x0) goto LAB_004b6d7e;
    this = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar5 + 1 + (long)this;
      this = (QString *)((long)&(this->d).d + 1);
    } while (*pcVar1 != '\0');
  }
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)pcVar5;
  QString::fromUtf8(&local_48,this,ba);
  QTextStream::operator<<(pQVar6,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)permission;
  if (*(char *)&pQVar6[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)permission;
  }
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)"(";
  QString::fromUtf8(&local_48,(QString *)0x1,ba_00);
  QTextStream::operator<<(pQVar6,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_60.stream = *(Stream **)permission;
  if ((local_60.stream)->space == true) {
    QTextStream::operator<<(&(local_60.stream)->ts,' ');
    local_60.stream = *(Stream **)permission;
  }
LAB_004b6e33:
  (local_60.stream)->ref = (local_60.stream)->ref + 1;
  puVar4 = Qt::staticMetaObject;
  qt_QMetaEnum_debugOperator
            (&local_58,(qint64)&local_60,(QMetaObject *)(long)*in_RDX,Qt::staticMetaObject);
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  pQVar6 = *(QTextStream **)permission;
  if (1 < iVar2) {
    ba_01.m_data = puVar4;
    ba_01.m_size = (qsizetype)")";
    QString::fromUtf8(&local_48,(QString *)0x1,ba_01);
    QTextStream::operator<<(pQVar6,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar6 = *(QTextStream **)permission;
    if (*(char *)&pQVar6[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(pQVar6,' ');
      pQVar6 = *(QTextStream **)permission;
    }
  }
  *(undefined8 *)permission = 0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar6;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QPermission &permission)
{
    const auto verbosity = debug.verbosity();
    QDebugStateSaver saver(debug);
    debug.nospace().setVerbosity(0);
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << permission.type().name() << "(";
    debug << permission.status();
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << ")";
    return debug;
}